

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O3

void __thiscall
Assimp::AMFImporter::Postprocess_BuildMeshSet
          (AMFImporter *this,CAMFImporter_NodeElement_Mesh *pNodeElement,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray,
          vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          *pVertexColorArray,CAMFImporter_NodeElement_Color *pObjectColor,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList,aiNode *pSceneNode)

{
  size_t *psVar1;
  aiVector3t<float> *paVar2;
  float *pfVar3;
  _Base_ptr p_Var4;
  pointer paVar5;
  long lVar6;
  size_t __n;
  float fVar7;
  float fVar8;
  float fVar9;
  pointer paVar10;
  bool bVar11;
  _Node *p_Var12;
  _List_node_base *p_Var13;
  ulong *puVar14;
  _List_node_base *p_Var15;
  long *plVar16;
  long *plVar17;
  void *pvVar18;
  size_t sVar19;
  aiColor4t<float> *__args;
  _List_node_base *p_Var20;
  undefined8 uVar21;
  uint *puVar22;
  runtime_error *this_00;
  _Base_ptr p_Var23;
  _List_node_base *p_Var24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *plVar29;
  CAMFImporter_NodeElement_Color ***pppCVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  long *plVar36;
  CAMFImporter_NodeElement_Triangle *tri_al;
  ulong uVar37;
  size_type __new_size;
  undefined8 *******pppppppuVar38;
  undefined8 *******pppppppuVar39;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vert_arr;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_arr;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> texcoord_arr;
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  complex_faces_toplist;
  list<unsigned_int,_std::allocator<unsigned_int>_> mesh_idx;
  anon_class_40_5_b0e7ad54 Vertex_CalculateColor;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  complex_faces_list;
  SPP_Material *cur_mat;
  CAMFImporter_NodeElement_Color *ne_volume_color;
  aiColor4D face_color;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_188;
  _List_node_base *local_170;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_168;
  _List_node_base *local_150;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_148;
  AMFImporter *local_130;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_128;
  _List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  local_120;
  undefined8 *******local_108;
  undefined8 *******local_100;
  ulong local_f8;
  anon_class_40_5_b0e7ad54 local_f0;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *local_c8;
  undefined1 local_c0 [16];
  size_t local_b0;
  CAMFImporter_NodeElement_Color *local_a8;
  undefined1 local_a0 [8];
  aiColor4D local_98;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  CAMFImporter_NodeElement *local_48;
  undefined1 local_40 [16];
  
  local_108 = &local_108;
  local_f8 = 0;
  uVar21 = (pNodeElement->super_CAMFImporter_NodeElement).Child.
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_60._8_8_ = &(pNodeElement->super_CAMFImporter_NodeElement).Child;
  local_130 = this;
  local_128 = pVertexCoordinateArray;
  local_100 = local_108;
  local_c8 = pMeshList;
  local_50._M_p = (pointer)pVertexColorArray;
  local_40._8_8_ = pObjectColor;
  if (uVar21 != local_60._8_8_) {
    do {
      p_Var20 = ((_List_node_base *)(uVar21 + 0x10))->_M_next;
      local_a0 = (undefined1  [8])0x0;
      local_a8 = (CAMFImporter_NodeElement_Color *)0x0;
      if (*(int *)&p_Var20->_M_prev == 0xf) {
        local_c0._0_8_ = local_c0;
        local_b0 = 0;
        local_120._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_120;
        local_120._M_impl._M_node._M_size = 0;
        local_120._M_impl._M_node.super__List_node_base._M_prev =
             local_120._M_impl._M_node.super__List_node_base._M_next;
        local_c0._8_8_ = local_c0._0_8_;
        local_60._M_allocated_capacity = uVar21;
        if (*(_List_node_base **)((long)(p_Var20 + 5) + 8) != (_List_node_base *)0x0) {
          this = local_130;
          bVar11 = Find_ConvertedMaterial
                             (local_130,(string *)(p_Var20 + 5),(SPP_Material **)&local_a8);
          if (!bVar11) {
            this = local_130;
            Throw_ID_NotFound(local_130,(string *)(p_Var20 + 5));
          }
        }
        for (p_Var13 = *(_List_node_base **)((long)(p_Var20 + 3) + 8);
            p_Var13 != (_List_node_base *)((long)(p_Var20 + 3) + 8U); p_Var13 = p_Var13->_M_next) {
          p_Var4 = (_Base_ptr)p_Var13[1]._M_next;
          if (*(int *)&p_Var4->_M_parent == 10) {
            local_f0.ne_volume_color = (CAMFImporter_NodeElement_Color **)0x0;
            local_f0.pObjectColor = (CAMFImporter_NodeElement_Color **)0x0;
            local_f0.cur_mat = (SPP_Material **)0x0;
            if (p_Var4[2]._M_parent != (_Base_ptr)0x0) {
              for (p_Var23 = p_Var4[1]._M_right; p_Var23 != (_Base_ptr)&p_Var4[1]._M_right;
                  p_Var23 = *(_Base_ptr *)p_Var23) {
                iVar35 = *(int *)&p_Var23->_M_left->_M_parent;
                pppCVar30 = &local_f0.pObjectColor;
                if (iVar35 == 0) {
LAB_003b8534:
                  *pppCVar30 = (CAMFImporter_NodeElement_Color **)p_Var23->_M_left;
                }
                else if (iVar35 == 0xb) {
                  pppCVar30 = (CAMFImporter_NodeElement_Color ***)&local_f0.cur_mat;
                  goto LAB_003b8534;
                }
              }
            }
            local_f0.pVertexColorArray =
                 (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  *)CONCAT44(local_f0.pVertexColorArray._4_4_,3);
            local_f0.ne_volume_color = (CAMFImporter_NodeElement_Color **)operator_new__(0xc);
            *(undefined4 *)
             &(((AMFImporter *)local_f0.ne_volume_color)->super_BaseImporter)._vptr_BaseImporter =
                 *(undefined4 *)&p_Var4[2]._M_left;
            *(undefined4 *)
             ((long)&(((AMFImporter *)local_f0.ne_volume_color)->super_BaseImporter).
                     _vptr_BaseImporter + 4) = *(undefined4 *)&p_Var4[2]._M_right;
            *(_Rb_tree_color *)
             &(((AMFImporter *)local_f0.ne_volume_color)->super_BaseImporter).importerUnits._M_t.
              _M_impl = p_Var4[3]._M_color;
            p_Var12 = std::__cxx11::
                      list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>
                      ::_M_create_node<Assimp::AMFImporter::SComplexFace_const&>
                                ((list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>
                                  *)local_c0,(SComplexFace *)&local_f0);
            std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
            local_b0 = local_b0 + 1;
            this = (AMFImporter *)local_f0.ne_volume_color;
            if ((AMFImporter *)local_f0.ne_volume_color != (AMFImporter *)0x0) {
              operator_delete__(local_f0.ne_volume_color);
            }
          }
          else if (*(int *)&p_Var4->_M_parent == 0) {
            local_a0 = (undefined1  [8])p_Var4;
          }
        }
        PostprocessHelper_SplitFacesByTextureID
                  (this,(list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                         *)local_c0,
                   (list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                    *)&local_120);
        for (local_150 = local_120._M_impl._M_node.super__List_node_base._M_next;
            local_150 != (_List_node_base *)&local_120;
            local_150 = (((_List_impl *)&local_150->_M_next)->_M_node).super__List_node_base._M_next
            ) {
          local_f0.pVertexColorArray =
               (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                *)local_50._M_p;
          local_f0.ne_volume_color = (CAMFImporter_NodeElement_Color **)local_a0;
          local_f0.pObjectColor = (CAMFImporter_NodeElement_Color **)(local_40 + 8);
          local_f0.cur_mat = (SPP_Material **)&local_a8;
          local_f0.pVertexCoordinateArray = local_128;
          p_Var13 = (_List_node_base *)operator_new(0x520);
          *(undefined8 *)((long)&p_Var13->_M_next + 4) = 0;
          local_40._0_8_ = p_Var13 + 1;
          memset((void *)local_40._0_8_,0,0xcc);
          p_Var13[0xe]._M_next = (_List_node_base *)0x0;
          p_Var13[0xe]._M_prev = (_List_node_base *)0x0;
          *(undefined1 *)&p_Var13[0xf]._M_next = 0;
          memset((void *)((long)&p_Var13[0xf]._M_next + 1),0x1b,0x3ff);
          *(undefined4 *)&p_Var13[0x4f]._M_next = 0;
          p_Var13[0x4f]._M_prev = (_List_node_base *)0x0;
          p_Var13[0x50]._M_next = (_List_node_base *)0x0;
          p_Var13[0x50]._M_prev = (_List_node_base *)0x0;
          p_Var13[0x51]._M_next = (_List_node_base *)0x0;
          *(undefined4 *)&p_Var13[0x51]._M_prev = 0;
          local_48 = (CAMFImporter_NodeElement *)(p_Var13 + 3);
          memset(local_48,0,0xa0);
          *(undefined4 *)&p_Var13->_M_next = 4;
          p_Var20 = *(_List_node_base **)
                     ((long)&(((_List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                                *)((long)local_150 + 0x18))->_M_impl)._M_node.super__List_node_base
                     + 8);
          *(int *)&p_Var13->_M_prev = (int)p_Var20;
          uVar37 = (ulong)p_Var20 & 0xffffffff;
          puVar14 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
          *puVar14 = uVar37;
          p_Var15 = (_List_node_base *)(puVar14 + 1);
          if (uVar37 != 0) {
            p_Var24 = p_Var15;
            do {
              *(undefined4 *)&p_Var24->_M_next = 0;
              p_Var24->_M_prev = (_List_node_base *)0x0;
              p_Var24 = p_Var24 + 1;
            } while (p_Var24 != p_Var15 + uVar37);
          }
          p_Var13[0xd]._M_next = p_Var15;
          local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
          local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (aiColor4t<float> *)0x0;
          local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (aiColor4t<float> *)0x0;
          uVar27 = (long)p_Var20 * 6 & 0x1fffffffe;
          local_170 = p_Var13;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                    (&local_188,uVar27);
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
                    (&local_168,uVar27);
          p_Var20 = local_170;
          psVar1 = &(((_List_impl *)&local_150->_M_next)->_M_node)._M_size;
          plVar16 = (long *)*psVar1;
          uVar37 = (ulong)*(uint *)plVar16[3];
          for (; (size_t *)plVar16 != psVar1; plVar16 = (long *)*plVar16) {
            if ((ulong)*(uint *)(plVar16 + 2) != 0) {
              uVar31 = 0;
              uVar25 = uVar37;
              do {
                uVar37 = (ulong)*(uint *)(plVar16[3] + uVar31 * 4);
                if (uVar25 < uVar37) {
                  uVar37 = uVar25;
                }
                uVar31 = uVar31 + 1;
                uVar25 = uVar37;
              } while (*(uint *)(plVar16 + 2) != uVar31);
            }
          }
          paVar5 = (local_128->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar25 = ((long)(local_128->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 2) *
                   -0x5555555555555555;
          if (uVar25 < uVar37 || uVar25 - uVar37 == 0) {
LAB_003b9185:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar37);
          }
          paVar2 = paVar5 + uVar37;
          if (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_188,
                       (iterator)
                       local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,paVar2);
          }
          else {
            (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = paVar2->z;
            fVar7 = paVar2->y;
            (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = paVar2->x;
            (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = fVar7;
            local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_188.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_98 = Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()
                               (&local_f0,uVar37);
          if (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_168,
                       (iterator)
                       local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_98);
          }
          else {
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->r = local_98.r;
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->g = local_98.g;
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->b = local_98.b;
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->a = local_98.a;
            local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          plVar16 = (long *)*psVar1;
          if ((uVar37 != 0) && ((size_t *)plVar16 != psVar1)) {
            do {
              uVar26 = *(uint *)(plVar16 + 2);
              if (uVar26 != 0) {
                uVar25 = 0;
                do {
                  if (uVar37 == *(uint *)(plVar16[3] + uVar25 * 4)) {
                    *(undefined4 *)(plVar16[3] + uVar25 * 4) = 0;
                    uVar26 = *(uint *)(plVar16 + 2);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 < uVar26);
              }
              plVar16 = (long *)*plVar16;
            } while ((size_t *)plVar16 != psVar1);
            plVar16 = (long *)*psVar1;
          }
          plVar36 = plVar16;
          if ((size_t *)plVar16 != psVar1) {
            uVar25 = 0;
LAB_003b88dc:
            do {
              if ((ulong)*(uint *)(plVar16 + 2) != 0) {
                uVar31 = 0;
                do {
                  uVar37 = (ulong)*(uint *)(plVar16[3] + uVar31 * 4);
                  plVar17 = plVar36;
                  if (uVar25 < uVar37) goto LAB_003b890d;
                  uVar31 = uVar31 + 1;
                } while (*(uint *)(plVar16 + 2) != uVar31);
              }
              plVar16 = (long *)*plVar16;
            } while ((size_t *)plVar16 != psVar1);
          }
LAB_003b8a5c:
          plVar29 = local_c8;
          if ((size_t *)plVar36 != psVar1) {
            do {
              lVar28 = plVar36[4];
              if (lVar28 != 0) {
                local_78 = (_Base_ptr)0x0;
                uStack_70 = (pointer)0x0;
                if (*(char *)(lVar28 + 0x50) == '\x01') {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_98._0_8_ = local_88;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_98,"IME: face color composed","");
                  std::runtime_error::runtime_error(this_00,(string *)&local_98);
                  *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
                  __cxa_throw(this_00,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_78 = *(_Base_ptr *)(lVar28 + 0xd8);
                uStack_70 = *(pointer *)(lVar28 + 0xe0);
                p_Var20 = local_170;
                if ((int)plVar36[2] != 0) {
                  lVar28 = (long)local_188.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_188.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  uVar37 = 0;
                  do {
                    uVar25 = (ulong)*(uint *)(plVar36[3] + uVar37 * 4);
                    uVar31 = ((long)local_188.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_188.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555;
                    if (uVar31 < uVar25 || uVar31 - uVar25 == 0) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar25);
                    }
                    paVar2 = local_188.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar25;
                    if (local_188.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_188.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                      _M_realloc_insert<aiVector3t<float>const&>
                                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                                 &local_188,
                                 (iterator)
                                 local_188.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,paVar2);
                    }
                    else {
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->z = paVar2->z;
                      fVar7 = paVar2->y;
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->x = paVar2->x;
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->y = fVar7;
                      local_188.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    if (local_168.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_168.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
                      _M_realloc_insert<aiColor4t<float>const&>
                                ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)
                                 &local_168,
                                 (iterator)
                                 local_168.
                                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (aiColor4t<float> *)&local_78);
                    }
                    else {
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->r = (float)local_78;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->g = local_78._4_4_;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->b = (float)uStack_70;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->a = uStack_70._4_4_;
                      local_168.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_168.
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    *(int *)(plVar36[3] + uVar37 * 4) =
                         (int)(lVar28 >> 2) * -0x55555555 + (int)uVar37;
                    uVar37 = uVar37 + 1;
                    p_Var20 = local_170;
                  } while (uVar37 < *(uint *)(plVar36 + 2));
                }
              }
              plVar36 = (long *)*plVar36;
            } while ((size_t *)plVar36 != psVar1);
            plVar36 = (long *)*psVar1;
          }
          paVar10 = local_188.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          paVar5 = local_188.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (plVar36[5] != 0) {
            pvVar18 = operator_new__(uVar27);
            if (uVar27 != 0) {
              memset(pvVar18,0,uVar27);
            }
            lVar28 = *(long *)(*psVar1 + 0x28);
            sVar19 = PostprocessHelper_GetTextureID_Or_Create
                               (local_130,(string *)(lVar28 + 0x78),(string *)(lVar28 + 0x98),
                                (string *)(lVar28 + 0xb8),(string *)(lVar28 + 0xd8));
            *(int *)&p_Var20[0xe]._M_prev = (int)sVar19;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_148,uVar27);
            __new_size = ((long)paVar10 - (long)paVar5 >> 2) * -0x5555555555555555;
            for (plVar16 = (long *)*psVar1; (size_t *)plVar16 != psVar1; plVar16 = (long *)*plVar16)
            {
              if ((int)plVar16[2] != 0) {
                lVar28 = 0;
                uVar37 = 0;
                do {
                  uVar27 = (ulong)*(uint *)(plVar16[3] + uVar37 * 4);
                  uVar25 = ((long)local_148.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_148.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555;
                  if (*(char *)((long)pvVar18 + uVar27) == '\0') {
                    if (uVar25 < uVar27 || uVar25 - uVar27 == 0) goto LAB_003b910b;
                    lVar6 = plVar16[5];
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar27].z =
                         *(float *)(lVar6 + 0x58 + lVar28);
                    uVar21 = *(undefined8 *)(lVar6 + 0x50 + lVar28);
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar27].x = (float)(int)uVar21;
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar27].y =
                         (float)(int)((ulong)uVar21 >> 0x20);
                    *(undefined1 *)((long)pvVar18 + uVar27) = 1;
                  }
                  else {
                    if (uVar25 < uVar27 || uVar25 - uVar27 == 0) goto LAB_003b910b;
                    lVar6 = plVar16[5];
                    pfVar3 = (float *)(lVar6 + 0x50 + lVar28);
                    if ((local_148.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar27].x == *pfVar3) &&
                       (!NAN(local_148.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar27].x) && !NAN(*pfVar3)))
                    {
                      pfVar3 = (float *)(lVar6 + 0x54 + lVar28);
                      if ((local_148.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar27].y == *pfVar3) &&
                         (!NAN(local_148.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar27].y) && !NAN(*pfVar3)
                         )) {
                        pfVar3 = (float *)(lVar6 + 0x58 + lVar28);
                        if ((local_148.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar27].z == *pfVar3) &&
                           (!NAN(local_148.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar27].z) &&
                            !NAN(*pfVar3))) goto LAB_003b8dc8;
                      }
                    }
                    uVar25 = ((long)local_188.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_188.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555;
                    if (uVar25 < uVar27 || uVar25 - uVar27 == 0) {
LAB_003b910b:
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar27);
                    }
                    paVar2 = local_188.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar27;
                    if (local_188.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_188.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                      _M_realloc_insert<aiVector3t<float>const&>
                                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                                 &local_188,
                                 (iterator)
                                 local_188.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,paVar2);
                    }
                    else {
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->z = paVar2->z;
                      fVar7 = paVar2->y;
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->x = paVar2->x;
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->y = fVar7;
                      local_188.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    if ((ulong)((long)local_168.
                                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_168.
                                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar27)
                    goto LAB_003b910b;
                    __args = local_168.
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar27;
                    if (local_168.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_168.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
                      _M_realloc_insert<aiColor4t<float>const&>
                                ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)
                                 &local_168,
                                 (iterator)
                                 local_168.
                                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,__args);
                    }
                    else {
                      fVar7 = __args->g;
                      fVar8 = __args->b;
                      fVar9 = __args->a;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->r = __args->r;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->g = fVar7;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->b = fVar8;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->a = fVar9;
                      local_168.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_168.
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar25 = ((long)local_148.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_148.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555;
                    uVar27 = __new_size;
                    if (uVar25 < __new_size || uVar25 - __new_size == 0) goto LAB_003b910b;
                    lVar6 = plVar16[5];
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[__new_size].z =
                         *(float *)(lVar6 + 0x58 + lVar28);
                    uVar21 = *(undefined8 *)(lVar6 + 0x50 + lVar28);
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[__new_size].x = (float)(int)uVar21;
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[__new_size].y =
                         (float)(int)((ulong)uVar21 >> 0x20);
                    *(int *)(plVar16[3] + uVar37 * 4) = (int)__new_size;
                    __new_size = __new_size + 1;
                  }
LAB_003b8dc8:
                  uVar37 = uVar37 + 1;
                  lVar28 = lVar28 + 0xc;
                } while (uVar37 < *(uint *)(plVar16 + 2));
              }
            }
            operator_delete__(pvVar18);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_148,__new_size);
            p_Var20 = local_170;
            plVar29 = local_c8;
          }
          paVar5 = local_188.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar28 = (long)local_188.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_188.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 0x3f;
          uVar27 = (((long)local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_188.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 6 + lVar28 >> 1) - lVar28;
          iVar35 = (int)uVar27;
          *(int *)((long)&p_Var20->_M_next + 4) = iVar35;
          uVar37 = (uVar27 & 0xffffffff) * 0xc;
          pvVar18 = operator_new__(uVar37);
          if (iVar35 != 0) {
            memset(pvVar18,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
          }
          *(void **)local_40._0_8_ = pvVar18;
          uVar37 = (uVar27 & 0xffffffff) << 4;
          p_Var20 = (_List_node_base *)operator_new__(uVar37);
          if (iVar35 != 0) {
            memset(p_Var20,0,uVar37);
          }
          local_48->_vptr_CAMFImporter_NodeElement = (_func_int **)p_Var20;
          __n = (uVar27 & 0xffffffff) * 0xc;
          memcpy(pvVar18,paVar5,__n);
          memcpy(p_Var20,local_168.
                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start,(uVar27 & 0xffffffff) << 4);
          paVar5 = local_148.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            p_Var20 = (_List_node_base *)operator_new__(__n);
            if (iVar35 != 0) {
              memset(p_Var20,0,((__n - 0xc) / 0xc) * 0xc + 0xc);
            }
            p_Var13 = local_170;
            local_170[7]._M_next = p_Var20;
            memcpy(p_Var20,paVar5,__n);
            *(undefined4 *)&p_Var13[0xb]._M_next = 2;
          }
          plVar16 = (long *)*psVar1;
          if ((size_t *)plVar16 != psVar1) {
            lVar28 = 0;
            do {
              aiFace::operator=((aiFace *)((long)&(local_170[0xd]._M_next)->_M_next + lVar28),
                                (aiFace *)(plVar16 + 2));
              plVar16 = (long *)*plVar16;
              lVar28 = lVar28 + 0x10;
            } while ((size_t *)plVar16 != psVar1);
          }
          sVar19 = (plVar29->super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl._M_node.
                   _M_size;
          p_Var20 = (_List_node_base *)operator_new(0x18);
          *(int *)&p_Var20[1]._M_next = (int)sVar19;
          std::__detail::_List_node_base::_M_hook(p_Var20);
          local_f8 = local_f8 + 1;
          p_Var20 = (_List_node_base *)operator_new(0x18);
          p_Var20[1]._M_next = local_170;
          std::__detail::_List_node_base::_M_hook(p_Var20);
          psVar1 = &(plVar29->super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl._M_node
                    ._M_size;
          *psVar1 = *psVar1 + 1;
          if (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.
                            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_148.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::__cxx11::
        _List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
        ::_M_clear(&local_120);
        this = (AMFImporter *)local_c0;
        std::__cxx11::
        _List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
        ::_M_clear((_List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                    *)this);
        uVar21 = local_60._M_allocated_capacity;
      }
      pppppppuVar38 = local_108;
      uVar21 = ((_List_node_base *)uVar21)->_M_next;
    } while (uVar21 != local_60._8_8_);
    pppppppuVar39 = pppppppuVar38;
    if ((undefined8 ********)local_108 != &local_108) {
      uVar26 = (uint)local_f8;
      pSceneNode->mNumMeshes = uVar26;
      puVar22 = (uint *)operator_new__((local_f8 & 0xffffffff) << 2);
      pSceneNode->mMeshes = puVar22;
      if (uVar26 != 0) {
        uVar37 = 0;
        do {
          pppppppuVar39 = pppppppuVar38 + 2;
          pppppppuVar38 = (undefined8 *******)*pppppppuVar38;
          pSceneNode->mMeshes[uVar37] = *(uint *)pppppppuVar39;
          uVar37 = uVar37 + 1;
          pppppppuVar39 = local_108;
        } while (uVar37 < pSceneNode->mNumMeshes);
      }
    }
    while ((undefined8 ********)pppppppuVar39 != &local_108) {
      pppppppuVar38 = (undefined8 *******)*pppppppuVar39;
      operator_delete(pppppppuVar39);
      pppppppuVar39 = pppppppuVar38;
    }
  }
  return;
LAB_003b890d:
  do {
    if ((ulong)*(uint *)(plVar17 + 2) != 0) {
      uVar31 = 0;
      do {
        uVar33 = (ulong)*(uint *)(plVar17[3] + uVar31 * 4);
        uVar32 = uVar37;
        if (uVar25 < uVar33) {
          uVar32 = uVar33;
        }
        uVar34 = uVar33;
        if (uVar37 < uVar33) {
          uVar34 = uVar37;
        }
        bVar11 = uVar33 < uVar37;
        uVar37 = uVar34;
        if (bVar11) {
          uVar37 = uVar32;
        }
        uVar31 = uVar31 + 1;
      } while (*(uint *)(plVar17 + 2) != uVar31);
    }
    plVar17 = (long *)*plVar17;
  } while ((size_t *)plVar17 != psVar1);
  if (uVar37 == uVar25) goto LAB_003b8a5c;
  paVar5 = (local_128->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar31 = ((long)(local_128->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 2) *
           -0x5555555555555555;
  if (uVar31 < uVar37 || uVar31 - uVar37 == 0) goto LAB_003b9185;
  paVar2 = paVar5 + uVar37;
  if (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_188,
               (iterator)
               local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,paVar2);
  }
  else {
    (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = paVar2->z;
    fVar7 = paVar2->y;
    (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = paVar2->x;
    (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = fVar7;
    local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_98 = Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()(&local_f0,uVar37);
  if (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
    _M_realloc_insert<aiColor4t<float>>
              ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_168,
               (iterator)
               local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_98);
  }
  else {
    (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->r = local_98.r;
    (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->g = local_98.g;
    (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->b = local_98.b;
    (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->a = local_98.a;
    local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  uVar25 = uVar25 + 1;
  plVar16 = (long *)*psVar1;
  if ((uVar37 != uVar25) && ((size_t *)plVar16 != psVar1)) {
    do {
      uVar26 = *(uint *)(plVar16 + 2);
      if (uVar26 != 0) {
        uVar31 = 0;
        do {
          if (uVar37 == *(uint *)(plVar16[3] + uVar31 * 4)) {
            *(int *)(plVar16[3] + uVar31 * 4) = (int)uVar25;
            uVar26 = *(uint *)(plVar16 + 2);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 < uVar26);
      }
      plVar16 = (long *)*plVar16;
    } while ((size_t *)plVar16 != psVar1);
    plVar16 = (long *)*psVar1;
  }
  plVar36 = plVar16;
  if ((size_t *)plVar16 == psVar1) goto LAB_003b8a5c;
  goto LAB_003b88dc;
}

Assistant:

void AMFImporter::Postprocess_BuildMeshSet(const CAMFImporter_NodeElement_Mesh& pNodeElement, const std::vector<aiVector3D>& pVertexCoordinateArray,
											const std::vector<CAMFImporter_NodeElement_Color*>& pVertexColorArray,
											const CAMFImporter_NodeElement_Color* pObjectColor, std::list<aiMesh*>& pMeshList, aiNode& pSceneNode)
{
std::list<unsigned int> mesh_idx;

	// all data stored in "volume", search for it.
	for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		const CAMFImporter_NodeElement_Color* ne_volume_color = nullptr;
		const SPP_Material* cur_mat = nullptr;

		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
		{
			/******************* Get faces *******************/
			const CAMFImporter_NodeElement_Volume* ne_volume = reinterpret_cast<const CAMFImporter_NodeElement_Volume*>(ne_child);

			std::list<SComplexFace> complex_faces_list;// List of the faces of the volume.
			std::list<std::list<SComplexFace> > complex_faces_toplist;// List of the face list for every mesh.

			// check if volume use material
			if(!ne_volume->MaterialID.empty())
			{
				if(!Find_ConvertedMaterial(ne_volume->MaterialID, &cur_mat)) Throw_ID_NotFound(ne_volume->MaterialID);
			}

			// inside "volume" collect all data and place to arrays or create new objects
			for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)
			{
				// color for volume
				if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Color)
				{
					ne_volume_color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_volume_child);
				}
				else if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Triangle)// triangles, triangles colors
				{
					const CAMFImporter_NodeElement_Triangle& tri_al = *reinterpret_cast<const CAMFImporter_NodeElement_Triangle*>(ne_volume_child);

					SComplexFace complex_face;

					// initialize pointers
					complex_face.Color = nullptr;
					complex_face.TexMap = nullptr;
					// get data from triangle children: color, texture coordinates.
					if(tri_al.Child.size())
					{
						for(const CAMFImporter_NodeElement* ne_triangle_child: tri_al.Child)
						{
							if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_Color)
								complex_face.Color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_triangle_child);
							else if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_TexMap)
								complex_face.TexMap = reinterpret_cast<const CAMFImporter_NodeElement_TexMap*>(ne_triangle_child);
						}
					}// if(tri_al.Child.size())

					// create new face and store it.
					complex_face.Face.mNumIndices = 3;
					complex_face.Face.mIndices = new unsigned int[3];
					complex_face.Face.mIndices[0] = static_cast<unsigned int>(tri_al.V[0]);
					complex_face.Face.mIndices[1] = static_cast<unsigned int>(tri_al.V[1]);
					complex_face.Face.mIndices[2] = static_cast<unsigned int>(tri_al.V[2]);
					complex_faces_list.push_back(complex_face);
				}
			}// for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)

			/**** Split faces list: one list per mesh ****/
			PostprocessHelper_SplitFacesByTextureID(complex_faces_list, complex_faces_toplist);

			/***** Create mesh for every faces list ******/
			for(std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
			{
				auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t
				{
					size_t rv;

					if(pBiggerThan != nullptr)
					{
						bool found = false;

						for(const SComplexFace& face: pFaceList)
						{
							for(size_t idx_vert = 0; idx_vert < face.Face.mNumIndices; idx_vert++)
							{
								if(face.Face.mIndices[idx_vert] > *pBiggerThan)
								{
									rv = face.Face.mIndices[idx_vert];
									found = true;

									break;
								}
							}

							if(found) break;
						}

						if(!found) return *pBiggerThan;
					}
					else
					{
						rv = pFaceList.front().Face.mIndices[0];
					}// if(pBiggerThan != nullptr) else

					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] < rv)
							{
								if(pBiggerThan != nullptr)
								{
									if(face.Face.mIndices[vi] > *pBiggerThan) rv = face.Face.mIndices[vi];
								}
								else
								{
									rv = face.Face.mIndices[vi];
								}
							}
						}
					}// for(const SComplexFace& face: pFaceList)

					return rv;
				};// auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t

				auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void
				{
					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] == pIdx_From) face.Face.mIndices[vi] = static_cast<unsigned int>(pIdx_To);
						}
					}
				};// auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void

				auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D
				{
					// Color priorities(In descending order):
					// 1. triangle color;
					// 2. vertex color;
					// 3. volume color;
					// 4. object color;
					// 5. material;
					// 6. default - invisible coat.
					//
					// Fill vertices colors in color priority list above that's points from 1 to 6.
					if((pIdx < pVertexColorArray.size()) && (pVertexColorArray[pIdx] != nullptr))// check for vertex color
					{
						if(pVertexColorArray[pIdx]->Composed)
							throw DeadlyImportError("IME: vertex color composed");
						else
							return pVertexColorArray[pIdx]->Color;
					}
					else if(ne_volume_color != nullptr)// check for volume color
					{
						if(ne_volume_color->Composed)
							throw DeadlyImportError("IME: volume color composed");
						else
							return ne_volume_color->Color;
					}
					else if(pObjectColor != nullptr)// check for object color
					{
						if(pObjectColor->Composed)
							throw DeadlyImportError("IME: object color composed");
						else
							return pObjectColor->Color;
					}
					else if(cur_mat != nullptr)// check for material
					{
						return cur_mat->GetColor(pVertexCoordinateArray.at(pIdx).x, pVertexCoordinateArray.at(pIdx).y, pVertexCoordinateArray.at(pIdx).z);
					}
					else// set default color.
					{
						return {0, 0, 0, 0};
					}// if((vi < pVertexColorArray.size()) && (pVertexColorArray[vi] != nullptr)) else

				};// auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D

				aiMesh* tmesh = new aiMesh;

				tmesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;// Only triangles is supported by AMF.
				//
				// set geometry and colors (vertices)
				//
				// copy faces/triangles
				tmesh->mNumFaces = static_cast<unsigned int>(face_list_cur.size());
				tmesh->mFaces = new aiFace[tmesh->mNumFaces];

				// Create vertices list and optimize indices. Optimisation mean following.In AMF all volumes use one big list of vertices. And one volume
				// can use only part of vertices list, for example: vertices list contain few thousands of vertices and volume use vertices 1, 3, 10.
				// Do you need all this thousands of garbage? Of course no. So, optimisation step transformate sparse indices set to continuous.
				size_t VertexCount_Max = tmesh->mNumFaces * 3;// 3 - triangles.
				std::vector<aiVector3D> vert_arr, texcoord_arr;
				std::vector<aiColor4D> col_arr;

				vert_arr.reserve(VertexCount_Max * 2);// "* 2" - see below TODO.
				col_arr.reserve(VertexCount_Max * 2);

				{// fill arrays
					size_t vert_idx_from, vert_idx_to;

					// first iteration.
					vert_idx_to = 0;
					vert_idx_from = VertexIndex_GetMinimal(face_list_cur, nullptr);
					vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
					col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
					if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					// rest iterations
					do
					{
						vert_idx_from = VertexIndex_GetMinimal(face_list_cur, &vert_idx_to);
						if(vert_idx_from == vert_idx_to) break;// all indices are transferred,

						vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
						col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
						vert_idx_to++;
						if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					} while(true);
				}// fill arrays. END.

				//
				// check if triangle colors are used and create additional faces if needed.
				//
				for(const SComplexFace& face_cur: face_list_cur)
				{
					if(face_cur.Color != nullptr)
					{
						aiColor4D face_color;
						size_t vert_idx_new = vert_arr.size();

						if(face_cur.Color->Composed)
							throw DeadlyImportError("IME: face color composed");
						else
							face_color = face_cur.Color->Color;

						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							vert_arr.push_back(vert_arr.at(face_cur.Face.mIndices[idx_ind]));
							col_arr.push_back(face_color);
							face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(vert_idx_new++);
						}
					}// if(face_cur.Color != nullptr)
				}// for(const SComplexFace& face_cur: face_list_cur)

				//
				// if texture is used then copy texture coordinates too.
				//
				if(face_list_cur.front().TexMap != nullptr)
				{
					size_t idx_vert_new = vert_arr.size();
					///TODO: clean unused vertices. "* 2": in certain cases - mesh full of triangle colors - vert_arr will contain duplicated vertices for
					/// colored triangles and initial vertices (for colored vertices) which in real became unused. This part need more thinking about
					/// optimisation.
					bool* idx_vert_used;

					idx_vert_used = new bool[VertexCount_Max * 2];
					for(size_t i = 0, i_e = VertexCount_Max * 2; i < i_e; i++) idx_vert_used[i] = false;

					// This ID's will be used when set materials ID in scene.
					tmesh->mMaterialIndex = static_cast<unsigned int>(PostprocessHelper_GetTextureID_Or_Create(face_list_cur.front().TexMap->TextureID_R,
																						face_list_cur.front().TexMap->TextureID_G,
																						face_list_cur.front().TexMap->TextureID_B,
																						face_list_cur.front().TexMap->TextureID_A));
					texcoord_arr.resize(VertexCount_Max * 2);
					for(const SComplexFace& face_cur: face_list_cur)
					{
						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							const size_t idx_vert = face_cur.Face.mIndices[idx_ind];

							if(!idx_vert_used[idx_vert])
							{
								texcoord_arr.at(idx_vert) = face_cur.TexMap->TextureCoordinate[idx_ind];
								idx_vert_used[idx_vert] = true;
							}
							else if(texcoord_arr.at(idx_vert) != face_cur.TexMap->TextureCoordinate[idx_ind])
							{
								// in that case one vertex is shared with many texture coordinates. We need to duplicate vertex with another texture
								// coordinates.
								vert_arr.push_back(vert_arr.at(idx_vert));
								col_arr.push_back(col_arr.at(idx_vert));
								texcoord_arr.at(idx_vert_new) = face_cur.TexMap->TextureCoordinate[idx_ind];
								face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(idx_vert_new++);
							}
						}// for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
					}// for(const SComplexFace& face_cur: face_list_cur)

					delete [] idx_vert_used;
					// shrink array
					texcoord_arr.resize(idx_vert_new);
				}// if(face_list_cur.front().TexMap != nullptr)

				//
				// copy collected data to mesh
				//
				tmesh->mNumVertices = static_cast<unsigned int>(vert_arr.size());
				tmesh->mVertices = new aiVector3D[tmesh->mNumVertices];
				tmesh->mColors[0] = new aiColor4D[tmesh->mNumVertices];

				memcpy(tmesh->mVertices, vert_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
				memcpy(tmesh->mColors[0], col_arr.data(), tmesh->mNumVertices * sizeof(aiColor4D));
				if(texcoord_arr.size() > 0)
				{
					tmesh->mTextureCoords[0] = new aiVector3D[tmesh->mNumVertices];
					memcpy(tmesh->mTextureCoords[0], texcoord_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
					tmesh->mNumUVComponents[0] = 2;// U and V stored in "x", "y" of aiVector3D.
				}

				size_t idx_face = 0;
				for(const SComplexFace& face_cur: face_list_cur) tmesh->mFaces[idx_face++] = face_cur.Face;

				// store new aiMesh
				mesh_idx.push_back(static_cast<unsigned int>(pMeshList.size()));
				pMeshList.push_back(tmesh);
			}// for(const std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
		}// if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
	}// for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)

	// if meshes was created then assign new indices with current aiNode
	if(!mesh_idx.empty())
	{
		std::list<unsigned int>::const_iterator mit = mesh_idx.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(mesh_idx.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *mit++;
	}// if(mesh_idx.size() > 0)
}